

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateContext::CreateContext
          (CreateContext *this,EGLDisplay display,EGLConfig config,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *shared,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  bool bVar1;
  GLES2Context *this_00;
  GLES2Context *pGVar2;
  GLES2ResourceManager *this_01;
  bool local_92;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> local_80;
  undefined1 local_70 [32];
  SharedPtr<tcu::ThreadUtil::Object> local_50 [2];
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *shared_local;
  EGLConfig config_local;
  EGLDisplay display_local;
  CreateContext *this_local;
  
  local_30 = context;
  context_local = shared;
  shared_local = (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)config;
  config_local = display;
  display_local = this;
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"CreateContext");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CreateContext_032674e8;
  this->m_display = config_local;
  this->m_config = shared_local;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_shared,shared);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_context);
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)shared);
  if (bVar1) {
    de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>
              (local_50,shared);
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,local_50);
    de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(local_50);
  }
  this_00 = (GLES2Context *)operator_new(0x60);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_70);
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)shared);
  if (bVar1) {
    pGVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(shared);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::SharedPtr
              (&local_80,&pGVar2->resourceManager);
  }
  else {
    this_01 = (GLES2ResourceManager *)operator_new(0x60);
    GLES2ResourceManager::GLES2ResourceManager(this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::SharedPtr(&local_80,this_01);
  }
  GLES2Context::GLES2Context(this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_70,&local_80);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)(local_70 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
            (local_30,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)(local_70 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)(local_70 + 0x10));
  if (bVar1) {
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::~SharedPtr(&local_80);
  }
  else {
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::~SharedPtr(&local_80);
  }
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_70);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=(&this->m_context,local_30);
  return;
}

Assistant:

CreateContext::CreateContext (EGLDisplay display, EGLConfig config, SharedPtr<GLES2Context> shared, SharedPtr<GLES2Context>& context)
	: tcu::ThreadUtil::Operation	("CreateContext")
	, m_display					(display)
	, m_config					(config)
	, m_shared					(shared)
{
	if (shared)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(shared));

	context = SharedPtr<GLES2Context>(new GLES2Context(getEvent(), (shared ? shared->resourceManager : SharedPtr<GLES2ResourceManager>(new GLES2ResourceManager))));
	m_context = context;
}